

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void setup_target_rate(AV1_COMP *cpi)

{
  int target;
  
  target = (cpi->ppi->gf_group).bit_allocation[cpi->gf_frame_index];
  if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
    av1_rc_set_frame_target(cpi,target,(cpi->common).width,(cpi->common).height);
  }
  (cpi->rc).base_frame_target = target;
  return;
}

Assistant:

static void setup_target_rate(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  int target_rate = gf_group->bit_allocation[cpi->gf_frame_index];

  if (has_no_stats_stage(cpi)) {
    av1_rc_set_frame_target(cpi, target_rate, cpi->common.width,
                            cpi->common.height);
  }

  rc->base_frame_target = target_rate;
}